

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O2

void predict_or_learn_active<true>(active *a,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  shared_data *psVar4;
  float fVar5;
  
  LEARNER::learner<char,_example>::learn(base,ec,0);
  fVar1 = (ec->l).simple.label;
  if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
    psVar4 = a->all->sd;
    fVar1 = psVar4->max_label;
    fVar2 = psVar4->min_label;
    fVar3 = (ec->pred).scalar;
    fVar5 = LEARNER::learner<char,_example>::sensitivity(base,ec,0);
    ec->confidence = ABS((fVar1 + fVar2) * -0.5 + fVar3) / fVar5;
  }
  return;
}

Assistant:

void predict_or_learn_active(active& a, single_learner& base, example& ec)
{
  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (ec.l.simple.label == FLT_MAX)
  {
    float threshold = (a.all->sd->max_label + a.all->sd->min_label) * 0.5f;
    ec.confidence = fabsf(ec.pred.scalar - threshold) / base.sensitivity(ec);
  }
}